

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int Strsafe_insert(char *data)

{
  uint uVar1;
  char *x;
  s_x1 *psVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  s_x1node *psVar6;
  char **ppcVar7;
  long lVar8;
  ulong uVar9;
  s_x1node *psVar10;
  int iVar11;
  ulong uVar12;
  s_x1node *psVar13;
  s_x1node **ppsVar14;
  
  psVar2 = x1a;
  if (x1a != (s_x1 *)0x0) {
    uVar3 = strhash(data);
    iVar11 = psVar2->size;
    lVar8 = (long)iVar11;
    uVar12 = (long)(int)uVar3 & lVar8 - 1U;
    psVar13 = (s_x1node *)psVar2->ht;
    ppsVar14 = (s_x1node **)(&psVar13->data + uVar12);
    do {
      psVar6 = *ppsVar14;
      if (psVar6 == (s_x1node *)0x0) {
        uVar1 = psVar2->count;
        if ((int)uVar1 < iVar11) {
          psVar6 = psVar2->tbl;
        }
        else {
          psVar6 = (s_x1node *)malloc(lVar8 << 6);
          if (psVar6 == (s_x1node *)0x0) {
            return 0;
          }
          psVar13 = psVar6 + lVar8 * 2;
          uVar12 = 0;
          iVar11 = (int)(lVar8 * 2);
          uVar9 = 0;
          if (0 < iVar11) {
            uVar9 = lVar8 * 2 & 0xffffffff;
          }
          for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
            (&psVar13->data)[uVar12] = (char *)0x0;
          }
          lVar8 = 0;
          uVar12 = 0;
          if (0 < (int)uVar1) {
            uVar12 = (ulong)uVar1;
          }
          for (; uVar12 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
            x = *(char **)((long)&psVar2->tbl->data + lVar8);
            uVar5 = strhash(x);
            ppcVar7 = &psVar13->data + (int)(uVar5 & iVar11 - 1U);
            if ((s_x1node *)*ppcVar7 == (s_x1node *)0x0) {
              psVar10 = (s_x1node *)0x0;
            }
            else {
              ((s_x1node *)*ppcVar7)->from = (s_x1node **)((long)&psVar6->next + lVar8);
              psVar10 = (s_x1node *)*ppcVar7;
            }
            *(s_x1node **)((long)&psVar6->next + lVar8) = psVar10;
            *(char **)((long)&psVar6->data + lVar8) = x;
            *(char ***)((long)&psVar6->from + lVar8) = ppcVar7;
            *ppcVar7 = (char *)((long)&psVar6->data + lVar8);
          }
          free(psVar2->tbl);
          psVar2->size = iVar11;
          psVar2->tbl = psVar6;
          psVar2->ht = (s_x1node **)psVar13;
          uVar12 = (ulong)(int)(iVar11 - 1U & uVar3);
        }
        psVar2->count = uVar1 + 1;
        psVar10 = psVar6 + (int)uVar1;
        psVar6[(int)uVar1].data = data;
        if ((s_x1node *)(&psVar13->data)[uVar12] == (s_x1node *)0x0) {
          psVar6 = (s_x1node *)0x0;
        }
        else {
          ((s_x1node *)(&psVar13->data)[uVar12])->from = &psVar10->next;
          psVar6 = (s_x1node *)(&psVar13->data)[uVar12];
        }
        psVar10->next = psVar6;
        (&psVar13->data)[uVar12] = (char *)psVar10;
        psVar10->from = psVar2->ht + uVar12;
        return 1;
      }
      iVar4 = strcmp(psVar6->data,data);
      ppsVar14 = &psVar6->next;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  int h;
  int ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)malloc(
      (sizeof(x1node) + sizeof(x1node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}